

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  char cVar1;
  int iVar2;
  FileOptions *pFVar3;
  long lVar4;
  
  if (0 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      cVar1 = (**(code **)(*(this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x28
                          ))();
      if (cVar1 == '\0') {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      cVar1 = (**(code **)(*(this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x28))
                        ();
      if (cVar1 == '\0') {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      cVar1 = (**(code **)(*(this->service_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x28))();
      if (cVar1 == '\0') {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      cVar1 = (**(code **)(*(this->extension_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x28))
                        ();
      if (cVar1 == '\0') {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 0x200) != 0) {
    pFVar3 = this->options_;
    if (pFVar3 == (FileOptions *)0x0) {
      pFVar3 = *(FileOptions **)(default_instance_ + 0xb8);
    }
    iVar2 = (*(pFVar3->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {

  for (int i = 0; i < message_type_size(); i++) {
    if (!this->message_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < enum_type_size(); i++) {
    if (!this->enum_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < service_size(); i++) {
    if (!this->service(i).IsInitialized()) return false;
  }
  for (int i = 0; i < extension_size(); i++) {
    if (!this->extension(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}